

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::TracingServiceImpl::MaybeEmitReceivedTriggers
          (TracingServiceImpl *this,TracingSession *tracing_session,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  pointer pTVar1;
  Trigger *this_00;
  size_t sVar2;
  long local_168;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_148;
  string local_130;
  string local_110;
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  
  sVar2 = tracing_session->num_triggers_emitted_into_trace;
  local_168 = sVar2 * 0x50 + 0x28;
  while( true ) {
    pTVar1 = (tracing_session->received_triggers).
             super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(tracing_session->received_triggers).
                       super__Vector_base<perfetto::TracingServiceImpl::TracingSession::TriggerInfo,_std::allocator<perfetto::TracingServiceImpl::TracingSession::TriggerInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x50) <= sVar2)
    break;
    protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered(&packet);
    this_00 = protos::pbzero::TracePacket::set_trigger<perfetto::protos::pbzero::Trigger>
                        (&packet.msg_.super_TracePacket);
    ::std::__cxx11::string::string
              ((string *)&local_110,(string *)((long)pTVar1 + local_168 + -0x20));
    protos::pbzero::Trigger::set_trigger_name(this_00,&local_110);
    ::std::__cxx11::string::~string((string *)&local_110);
    ::std::__cxx11::string::string
              ((string *)&local_130,(string *)((long)&pTVar1->boot_time_ns + local_168));
    protos::pbzero::Trigger::set_producer_name(this_00,&local_130);
    ::std::__cxx11::string::~string((string *)&local_130);
    protos::pbzero::Trigger::set_trusted_producer_uid
              (this_00,*(int32_t *)((long)&(pTVar1->trigger_name).field_2 + local_168 + 8U));
    protos::pbzero::TracePacket::set_timestamp
              (&packet.msg_.super_TracePacket,*(uint64_t *)((long)pTVar1 + local_168 + -0x28));
    protos::pbzero::TracePacket::set_trusted_uid(&packet.msg_.super_TracePacket,this->uid_);
    protos::pbzero::TracePacket::set_trusted_packet_sequence_id(&packet.msg_.super_TracePacket,1);
    protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::SerializeAsArray
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148,&packet);
    anon_unknown_4::SerializeAndAppendPacket
              (packets,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_148);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_148);
    tracing_session->num_triggers_emitted_into_trace =
         tracing_session->num_triggers_emitted_into_trace + 1;
    protozero::MessageArena::~MessageArena(&packet.msg_.root_arena_);
    protozero::ScatteredStreamWriter::~ScatteredStreamWriter(&packet.writer_);
    protozero::ScatteredHeapBuffer::~ScatteredHeapBuffer(&packet.shb_);
    sVar2 = sVar2 + 1;
    local_168 = local_168 + 0x50;
  }
  return;
}

Assistant:

void TracingServiceImpl::MaybeEmitReceivedTriggers(
    TracingSession* tracing_session,
    std::vector<TracePacket>* packets) {
  PERFETTO_DCHECK(tracing_session->num_triggers_emitted_into_trace <=
                  tracing_session->received_triggers.size());
  for (size_t i = tracing_session->num_triggers_emitted_into_trace;
       i < tracing_session->received_triggers.size(); ++i) {
    const auto& info = tracing_session->received_triggers[i];
    protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
    auto* trigger = packet->set_trigger();
    trigger->set_trigger_name(info.trigger_name);
    trigger->set_producer_name(info.producer_name);
    trigger->set_trusted_producer_uid(static_cast<int32_t>(info.producer_uid));

    packet->set_timestamp(info.boot_time_ns);
    packet->set_trusted_uid(static_cast<int32_t>(uid_));
    packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
    SerializeAndAppendPacket(packets, packet.SerializeAsArray());
    ++tracing_session->num_triggers_emitted_into_trace;
  }
}